

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate QDate::fromString(QString *string,QStringView format,int baseYear,QCalendar cal)

{
  long lVar1;
  bool bVar2;
  Type in_ECX;
  QDate *in_RDX;
  QTime *in_RSI;
  void *pvVar3;
  QDateTimeParser *in_RDI;
  QDateTimeParser *in_R8;
  long in_FS_OFFSET;
  QDateTimeParser dt;
  QDate date;
  QStringView in_stack_00000260;
  QLocale *in_stack_fffffffffffffec8;
  QDateTimeParser *in_stack_fffffffffffffed0;
  Context in_stack_ffffffffffffff08;
  int baseYear_00;
  QCalendar in_stack_ffffffffffffff18;
  QString *in_stack_ffffffffffffff28;
  QDateTimeParser *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDate((QDate *)in_stack_fffffffffffffed0);
  pvVar3 = (void *)0xe;
  QDateTimeParser::QDateTimeParser
            (in_RDI,in_ECX,in_stack_ffffffffffffff08,in_stack_ffffffffffffff18);
  baseYear_00 = (int)((ulong)in_RDI >> 0x20);
  QLocale::c(&stack0xffffffffffffff28,pvVar3);
  QDateTimeParser::setDefaultLocale(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  QLocale::~QLocale((QLocale *)0x56b5a9);
  bVar2 = QDateTimeParser::parseFormat(in_stack_ffffffffffffffd0,in_stack_00000260);
  if (bVar2) {
    QDateTimeParser::fromString(in_R8,in_stack_ffffffffffffff28,in_RDX,in_RSI,baseYear_00);
  }
  QDateTimeParser::~QDateTimeParser(in_stack_fffffffffffffed0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDate)-0x5555555555555556;
}

Assistant:

QDate QDate::fromString(const QString &string, QStringView format, int baseYear, QCalendar cal)
{
    QDate date;
#if QT_CONFIG(datetimeparser)
    QDateTimeParser dt(QMetaType::QDate, QDateTimeParser::FromString, cal);
    dt.setDefaultLocale(QLocale::c());
    if (dt.parseFormat(format))
        dt.fromString(string, &date, nullptr, baseYear);
#else
    Q_UNUSED(string);
    Q_UNUSED(format);
    Q_UNUSED(baseYear);
    Q_UNUSED(cal);
#endif
    return date;
}